

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatTerm.cpp
# Opt level: O1

size_t Kernel::FlatTerm::getEntryCount(Term *t)

{
  uint uVar1;
  uint uVar2;
  TermList this;
  
  if (((t->_args[0]._content & 0x10) == 0) || (t->_functor != 0)) {
    uVar2 = t->_weight;
    uVar1 = Term::numVarOccs(t);
  }
  else {
    this = SortHelper::getEqualityArgumentSort((Literal *)t);
    uVar1 = Term::numVarOccs(t);
    if (-1 < *(int *)&t->field_0xc) {
      uVar2 = 1;
      if ((this._content & 1) == 0) {
        uVar2 = Term::numVarOccs((Term *)this._content);
      }
      uVar1 = uVar2 + uVar1;
    }
    uVar2 = t->_weight + 1;
  }
  return (ulong)uVar2 * 3 + (ulong)uVar1 * -2;
}

Assistant:

size_t FlatTerm::getEntryCount(Term* t)
{
  //FUNCTION_ENTRY_COUNT entries per function and one per variable
  if (t->isLiteral() && static_cast<Literal*>(t)->isEquality()) {
    // we add the type to the flat term for equalities as an extra,
    // which requires some additional calculation
    auto sort = SortHelper::getEqualityArgumentSort(static_cast<Literal*>(t));
    unsigned numVarOccs = t->numVarOccs();
    if (!t->isTwoVarEquality()) {
      // in case of non-two-var equalities, the variables in
      // the type are not counted by Term::numVarOccs
      numVarOccs += sort.isVar() ? 1 : sort.term()->numVarOccs();
    }
    // the weight is corrected to be conservative in the
    // monomorphic case, we uncorrect it by adding 1
    return (t->weight()+1)*FUNCTION_ENTRY_COUNT-(FUNCTION_ENTRY_COUNT-1)*numVarOccs;
  }
  return t->weight()*FUNCTION_ENTRY_COUNT-(FUNCTION_ENTRY_COUNT-1)*t->numVarOccs();
}